

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

int nni_chunk_grow(nni_chunk *ch,size_t newsz,size_t headwanted)

{
  uint8_t *puVar1;
  size_t headroom;
  uint8_t *newbuf;
  size_t headwanted_local;
  size_t newsz_local;
  nni_chunk *ch_local;
  
  headwanted_local = newsz;
  if (newsz < ch->ch_len) {
    headwanted_local = ch->ch_len;
  }
  if (((ch->ch_ptr < ch->ch_buf) || (ch->ch_ptr == (uint8_t *)0x0)) ||
     (ch->ch_buf + ch->ch_cap <= ch->ch_ptr)) {
    if (ch->ch_cap <= headwanted_local + headwanted) {
      puVar1 = (uint8_t *)nni_zalloc(headwanted_local + headwanted);
      if (puVar1 == (uint8_t *)0x0) {
        return 2;
      }
      nni_free(ch->ch_buf,ch->ch_cap);
      ch->ch_cap = headwanted_local + headwanted;
      ch->ch_buf = puVar1;
    }
    ch->ch_ptr = ch->ch_buf + headwanted;
    ch_local._4_4_ = 0;
  }
  else {
    puVar1 = ch->ch_ptr + -(long)ch->ch_buf;
    newbuf = (uint8_t *)headwanted;
    if (headwanted < puVar1) {
      newbuf = puVar1;
    }
    if (((uint8_t *)ch->ch_cap < newbuf + headwanted_local) || (puVar1 < newbuf)) {
      if (headwanted_local < ch->ch_cap - (long)puVar1) {
        headwanted_local = ch->ch_cap - (long)puVar1;
      }
      puVar1 = (uint8_t *)nni_zalloc((size_t)(newbuf + headwanted_local));
      if (puVar1 == (uint8_t *)0x0) {
        ch_local._4_4_ = 2;
      }
      else {
        if (ch->ch_len != 0) {
          memcpy(puVar1 + (long)newbuf,ch->ch_ptr,ch->ch_len);
        }
        nni_free(ch->ch_buf,ch->ch_cap);
        ch->ch_buf = puVar1;
        ch->ch_ptr = puVar1 + (long)newbuf;
        ch->ch_cap = (size_t)(newbuf + headwanted_local);
        ch_local._4_4_ = 0;
      }
    }
    else {
      ch_local._4_4_ = 0;
    }
  }
  return ch_local._4_4_;
}

Assistant:

static int
nni_chunk_grow(nni_chunk *ch, size_t newsz, size_t headwanted)
{
	uint8_t *newbuf;

	// We assume that if the pointer is a valid pointer, and inside
	// the backing store, then the entire data length fits.  In this
	// case we perform a logical realloc, except we don't copy any
	// unreferenced data.  We do preserve the headroom of the previous
	// use, since that may be there for a reason.
	//
	// The test below also covers the case where the pointers are both
	// NULL, or the capacity is zero.

	// No shrinking (violets)
	if (newsz < ch->ch_len) {
		newsz = ch->ch_len;
	}

	if ((ch->ch_ptr >= ch->ch_buf) && (ch->ch_ptr != NULL) &&
	    (ch->ch_ptr < (ch->ch_buf + ch->ch_cap))) {
		size_t headroom = (size_t) (ch->ch_ptr - ch->ch_buf);
		if (headwanted < headroom) {
			headwanted = headroom; // Never shrink this.
		}
		if (((newsz + headwanted) <= ch->ch_cap) &&
		    (headwanted <= headroom)) {
			// We have enough space at the ends already.
			return (0);
		}
		// Make sure we allocate at least as much tail room as we
		// previously had.

		if (newsz < (ch->ch_cap - headroom)) {
			newsz = ch->ch_cap - headroom;
		}

		if ((newbuf = nni_zalloc(newsz + headwanted)) == NULL) {
			return (NNG_ENOMEM);
		}
		// Copy all the data, but not header or trailer.
		if (ch->ch_len > 0) {
			memcpy(newbuf + headwanted, ch->ch_ptr, ch->ch_len);
		}
		nni_free(ch->ch_buf, ch->ch_cap);
		ch->ch_buf = newbuf;
		ch->ch_ptr = newbuf + headwanted;
		ch->ch_cap = newsz + headwanted;
		return (0);
	}

	// We either don't have a data pointer yet, or it doesn't reference
	// the backing store.  In this case, we just check against the
	// allocated capacity and grow, or don't grow.
	if ((newsz + headwanted) >= ch->ch_cap) {
		if ((newbuf = nni_zalloc(newsz + headwanted)) == NULL) {
			return (NNG_ENOMEM);
		}
		nni_free(ch->ch_buf, ch->ch_cap);
		ch->ch_cap = newsz + headwanted;
		ch->ch_buf = newbuf;
	}

	ch->ch_ptr = ch->ch_buf + headwanted;
	return (0);
}